

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

int connect_to_server(void)

{
  int iVar1;
  int local_c;
  int rc;
  
  connected_socket = open_socket_to_openssh_server();
  if (connected_socket == -1) {
    local_c = -1;
  }
  else {
    iVar1 = libssh2_session_handshake(connected_session,connected_socket);
    if (iVar1 == 0) {
      local_c = 0;
    }
    else {
      print_last_session_error("libssh2_session_handshake");
      local_c = libssh2_session_last_errno(connected_session);
    }
  }
  return local_c;
}

Assistant:

static int connect_to_server(void)
{
    int rc;
    connected_socket = open_socket_to_openssh_server();
    if(connected_socket == LIBSSH2_INVALID_SOCKET) {
        return LIBSSH2_ERROR_SOCKET_NONE;
    }

    rc = libssh2_session_handshake(connected_session, connected_socket);
    if(rc) {
        print_last_session_error("libssh2_session_handshake");
        return libssh2_session_last_errno(connected_session);
    }

    return LIBSSH2_ERROR_NONE;
}